

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshCache.cpp
# Opt level: O0

bool __thiscall irr::scene::CMeshCache::renameMesh(CMeshCache *this,IMesh *mesh,path *name)

{
  u32 uVar1;
  int iVar2;
  MeshEntry *pMVar3;
  undefined4 extraout_var;
  array<irr::scene::CMeshCache::MeshEntry> *in_RDX;
  path *in_RSI;
  SNamedPath *in_RDI;
  u32 i;
  uint index;
  uint local_24;
  SNamedPath *this_00;
  
  local_24 = 0;
  this_00 = in_RDI;
  while( true ) {
    index = local_24;
    uVar1 = core::array<irr::scene::CMeshCache::MeshEntry>::size
                      ((array<irr::scene::CMeshCache::MeshEntry> *)0x30486b);
    if (uVar1 <= index) {
      return false;
    }
    pMVar3 = core::array<irr::scene::CMeshCache::MeshEntry>::operator[]
                       ((array<irr::scene::CMeshCache::MeshEntry> *)in_RDI,index);
    if ((path *)pMVar3->Mesh == in_RSI) break;
    pMVar3 = core::array<irr::scene::CMeshCache::MeshEntry>::operator[]
                       ((array<irr::scene::CMeshCache::MeshEntry> *)in_RDI,index);
    if (pMVar3->Mesh != (IAnimatedMesh *)0x0) {
      pMVar3 = core::array<irr::scene::CMeshCache::MeshEntry>::operator[]
                         ((array<irr::scene::CMeshCache::MeshEntry> *)in_RDI,index);
      iVar2 = (*(pMVar3->Mesh->super_IMesh)._vptr_IMesh[0xd])(pMVar3->Mesh,0,0xff,0xffffffff);
      if ((path *)CONCAT44(extraout_var,iVar2) == in_RSI) break;
    }
    local_24 = local_24 + 1;
  }
  core::array<irr::scene::CMeshCache::MeshEntry>::operator[]
            ((array<irr::scene::CMeshCache::MeshEntry> *)in_RDI,index);
  irr::io::SNamedPath::setPath(this_00,in_RSI);
  core::array<irr::scene::CMeshCache::MeshEntry>::sort(in_RDX);
  return true;
}

Assistant:

bool CMeshCache::renameMesh(const IMesh *const mesh, const io::path &name)
{
	for (u32 i = 0; i < Meshes.size(); ++i) {
		if (Meshes[i].Mesh == mesh || (Meshes[i].Mesh && Meshes[i].Mesh->getMesh(0) == mesh)) {
			Meshes[i].NamedPath.setPath(name);
			Meshes.sort();
			return true;
		}
	}

	return false;
}